

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintCharsAsStringTo<char16_t>(char16_t *begin,size_t len,ostream *os)

{
  bool bVar1;
  CharFormat CVar2;
  char *pcVar3;
  ostream *poVar4;
  ostream *in_RDX;
  ulong in_RSI;
  char16_t *in_RDI;
  char16_t cur;
  size_t index;
  CharFormat print_format;
  bool is_previous_hex;
  char *quote_prefix;
  undefined6 in_stack_ffffffffffffffc8;
  char16_t cVar5;
  ulong uVar6;
  CharFormat local_28;
  
  pcVar3 = GetCharWidthPrefix(*in_RDI);
  poVar4 = std::operator<<(in_RDX,pcVar3);
  std::operator<<(poVar4,"\"");
  bVar1 = false;
  local_28 = kAsIs;
  for (uVar6 = 0; uVar6 < in_RSI; uVar6 = uVar6 + 1) {
    cVar5 = in_RDI[uVar6];
    if ((bVar1) && (bVar1 = IsXDigit(L'\0'), bVar1)) {
      poVar4 = std::operator<<(in_RDX,"\" ");
      poVar4 = std::operator<<(poVar4,pcVar3);
      std::operator<<(poVar4,"\"");
    }
    CVar2 = PrintAsStringLiteralTo
                      ((char16_t)(uVar6 >> 0x30),
                       (ostream *)CONCAT26(cVar5,in_stack_ffffffffffffffc8));
    bVar1 = CVar2 == kHexEscape;
    if (bVar1) {
      local_28 = kHexEscape;
    }
  }
  std::operator<<(in_RDX,"\"");
  return local_28;
}

Assistant:

static CharFormat PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const quote_prefix = GetCharWidthPrefix(*begin);
  *os << quote_prefix << "\"";
  bool is_previous_hex = false;
  CharFormat print_format = kAsIs;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << quote_prefix << "\"";
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
    // Remember if any characters required hex escaping.
    if (is_previous_hex) {
      print_format = kHexEscape;
    }
  }
  *os << "\"";
  return print_format;
}